

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O2

Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
 __thiscall
Lib::
perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
          (Lib *this,MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *t)

{
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *extraout_RDX;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  PVar1;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_30;
  
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (&local_30,&t->_factors);
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
             *)this,(MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_30);
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_30);
  PVar1._ptr = extraout_RDX;
  PVar1._0_8_ = this;
  return PVar1;
}

Assistant:

Perfect<T, Cmp> perfect(T t) 
{ return Perfect<T, Cmp>(std::move(t)); }